

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O2

Glyph * __thiscall
sf::Font::getGlyph(Font *this,Uint32 codePoint,uint characterSize,bool bold,float outlineThickness)

{
  uint uVar1;
  mapped_type *this_00;
  iterator iVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long_long,_sf::Glyph>_>,_bool> pVar3;
  Uint64 key;
  uint local_64;
  ulong local_60;
  pair<unsigned_long_long,_sf::Glyph> local_58;
  
  local_64 = characterSize;
  this_00 = std::
            map<unsigned_int,_sf::Font::Page,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sf::Font::Page>_>_>
            ::operator[](&this->m_pages,&local_64);
  uVar1 = FT_Get_Char_Index(this->m_face,codePoint);
  local_60 = (ulong)uVar1 | CONCAT44(outlineThickness,(uint)bold << 0x1f);
  iVar2 = std::
          _Rb_tree<unsigned_long_long,_std::pair<const_unsigned_long_long,_sf::Glyph>,_std::_Select1st<std::pair<const_unsigned_long_long,_sf::Glyph>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_sf::Glyph>_>_>
          ::find((_Rb_tree<unsigned_long_long,_std::pair<const_unsigned_long_long,_sf::Glyph>,_std::_Select1st<std::pair<const_unsigned_long_long,_sf::Glyph>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_sf::Glyph>_>_>
                  *)this_00,&local_60);
  if ((_Rb_tree_header *)iVar2._M_node == &(this_00->glyphs)._M_t._M_impl.super__Rb_tree_header) {
    loadGlyph(&local_58.second,this,codePoint,local_64,bold,outlineThickness);
    local_58.first = local_60;
    pVar3 = std::
            _Rb_tree<unsigned_long_long,std::pair<unsigned_long_long_const,sf::Glyph>,std::_Select1st<std::pair<unsigned_long_long_const,sf::Glyph>>,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,sf::Glyph>>>
            ::_M_emplace_unique<std::pair<unsigned_long_long,sf::Glyph>>
                      ((_Rb_tree<unsigned_long_long,std::pair<unsigned_long_long_const,sf::Glyph>,std::_Select1st<std::pair<unsigned_long_long_const,sf::Glyph>>,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,sf::Glyph>>>
                        *)this_00,&local_58);
    iVar2._M_node = (_Base_ptr)pVar3.first._M_node;
  }
  return (Glyph *)&iVar2._M_node[1]._M_parent;
}

Assistant:

const Glyph& Font::getGlyph(Uint32 codePoint, unsigned int characterSize, bool bold, float outlineThickness) const
{
    // Get the page corresponding to the character size
    GlyphTable& glyphs = m_pages[characterSize].glyphs;

    // Build the key by combining the glyph index (based on code point), bold flag, and outline thickness
    Uint64 key = combine(outlineThickness, bold, FT_Get_Char_Index(static_cast<FT_Face>(m_face), codePoint));

    // Search the glyph into the cache
    GlyphTable::const_iterator it = glyphs.find(key);
    if (it != glyphs.end())
    {
        // Found: just return it
        return it->second;
    }
    else
    {
        // Not found: we have to load it
        Glyph glyph = loadGlyph(codePoint, characterSize, bold, outlineThickness);
        return glyphs.insert(std::make_pair(key, glyph)).first->second;
    }
}